

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.cpp
# Opt level: O3

void __thiscall
AbstractTaskProvider::AbstractTaskProvider(AbstractTaskProvider *this,AbstractTaskProvider *param_1)

{
  undefined1 auVar1 [16];
  
  this->_vptr_AbstractTaskProvider = (_func_int **)&PTR__AbstractTaskProvider_001fec98;
  (this->_completion).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->_completion).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->_completion).super___mutex_base._M_mutex + 0x10) = 0;
  (this->_completion).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->_completion).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  auVar1 = ZEXT416(0) << 0x40;
  this->_taskCount = (atomic<unsigned_long>)auVar1._0_8_;
  this->_givenTaskCount = (atomic<unsigned_long>)auVar1._8_8_;
  *(undefined1 (*) [16])((long)&(this->_givenTaskCount).super___atomic_base<unsigned_long>._M_i + 1)
       = auVar1;
  std::condition_variable::condition_variable(&this->_waiting);
  this->_exceptionRaised = false;
  return;
}

Assistant:

AbstractTaskProvider::AbstractTaskProvider( const AbstractTaskProvider & )
    : _taskCount         ( 0 )
    , _givenTaskCount    ( 0 )
    , _completedTaskCount( 0 )
    , _running           ( false )
    , _exceptionRaised   ( false )
{
}